

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

bool __thiscall DEnterKey::Responder(DEnterKey *this,event_t *ev)

{
  BYTE BVar1;
  DMenu *pDVar2;
  
  BVar1 = ev->type;
  if (BVar1 == '\x01') {
    *this->pKey = (int)ev->data1;
    menuactive = MENU_On;
    SetMenuMessage(this,0);
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
    pDVar2 = (this->super_DMenu).mParentMenu.field_0.p;
    (*(pDVar2->super_DObject)._vptr_DObject[8])(pDVar2,(ulong)(ev->data1 == 1 | 10),0);
  }
  return BVar1 == '\x01';
}

Assistant:

bool Responder(event_t *ev)
	{
		if (ev->type == EV_KeyDown)
		{
			*pKey = ev->data1;
			menuactive = MENU_On;
			SetMenuMessage(0);
			Close();
			mParentMenu->MenuEvent((ev->data1 == KEY_ESCAPE)? MKEY_Abort : MKEY_Input, 0);
			return true;
		}
		return false;
	}